

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O0

BOOL __thiscall Js::JavascriptProxy::HasOwnProperty(JavascriptProxy *this,PropertyId propertyId)

{
  code *pcVar1;
  undefined4 propertyId_00;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  ScriptContext *requestContext;
  undefined1 local_48 [8];
  PropertyDescriptor propertyDesc;
  PropertyId propertyId_local;
  JavascriptProxy *this_local;
  
  AssertCount = AssertCount + 1;
  propertyDesc._44_4_ = propertyId;
  Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar4 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                              ,0x1e6,"(0)","FALSE");
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar4 = 0;
  PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_48);
  propertyId_00 = propertyDesc._44_4_;
  requestContext = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  BVar3 = GetOwnPropertyDescriptor
                    ((RecyclableObject *)this,propertyId_00,requestContext,
                     (PropertyDescriptor *)local_48);
  return BVar3;
}

Assistant:

BOOL JavascriptProxy::HasOwnProperty(PropertyId propertyId)
    {
        // should never come here and it will be redirected to GetOwnPropertyDescriptor
        Assert(FALSE);
        PropertyDescriptor propertyDesc;
        return GetOwnPropertyDescriptor(this, propertyId, GetScriptContext(), &propertyDesc);
    }